

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O2

void __thiscall diffusion::ShmWriter::~ShmWriter(ShmWriter *this)

{
  ~ShmWriter(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

ShmWriter::~ShmWriter() {
    boost::interprocess::shared_memory_object::remove(shm_name_.c_str());
}